

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConverterRegistry.cpp
# Opt level: O2

ConverterFunction
SoapySDR::ConverterRegistry::getFunction(string *sourceFormat,string *targetFormat)

{
  size_type sVar1;
  mapped_type *pmVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  long lVar5;
  runtime_error *prVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  sVar1 = std::map<$5159af05$>::count(&formatConverters_abi_cxx11_,sourceFormat);
  if (sVar1 == 0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_80,
                   "ConverterRegistry::getFunction() conversion source not registered; sourceFormat="
                   ,sourceFormat);
    std::operator+(&local_60,&local_80,", targetFormat=");
    std::operator+(&local_40,&local_60,targetFormat);
    std::runtime_error::runtime_error(prVar6,(string *)&local_40);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pmVar2 = std::map<$5159af05$>::operator[](&formatConverters_abi_cxx11_,sourceFormat);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>_>_>_>
          ::count(pmVar2,targetFormat);
  if (sVar3 != 0) {
    pmVar2 = std::map<$5159af05$>::operator[](&formatConverters_abi_cxx11_,sourceFormat);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>_>_>_>
             ::operator[](pmVar2,targetFormat);
    if ((pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
      pmVar2 = std::map<$5159af05$>::operator[](&formatConverters_abi_cxx11_,sourceFormat);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>_>_>_>
               ::operator[](pmVar2,targetFormat);
      lVar5 = std::_Rb_tree_decrement(&(pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header);
      return *(ConverterFunction *)(lVar5 + 0x28);
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_80,
                   "ConverterRegistry::getFunction() no functions found for registered conversion; sourceFormat="
                   ,sourceFormat);
    std::operator+(&local_60,&local_80,", targetFormat=");
    std::operator+(&local_40,&local_60,targetFormat);
    std::runtime_error::runtime_error(prVar6,(string *)&local_40);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_80,
                 "ConverterRegistry::getFunction() conversion target not registered; sourceFormat=",
                 sourceFormat);
  std::operator+(&local_60,&local_80,", targetFormat=");
  std::operator+(&local_40,&local_60,targetFormat);
  std::runtime_error::runtime_error(prVar6,(string *)&local_40);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

SoapySDR::ConverterRegistry::ConverterFunction SoapySDR::ConverterRegistry::getFunction(const std::string &sourceFormat, const std::string &targetFormat)
{
  if (formatConverters.count(sourceFormat) == 0)
    {
      throw std::runtime_error("ConverterRegistry::getFunction() conversion source not registered; "
			       "sourceFormat="+sourceFormat+", targetFormat="+targetFormat);
    }
  
  if (formatConverters[sourceFormat].count(targetFormat) == 0)
    {
      throw std::runtime_error("ConverterRegistry::getFunction() conversion target not registered; "
			       "sourceFormat="+sourceFormat+", targetFormat="+targetFormat);
    }

  if (formatConverters[sourceFormat][targetFormat].size() == 0)
    {
      throw std::runtime_error("ConverterRegistry::getFunction() no functions found for registered conversion; "
			       "sourceFormat="+sourceFormat+", targetFormat="+targetFormat);
    }

  return formatConverters[sourceFormat][targetFormat].rbegin()->second;
}